

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatTimeInMillisAsSeconds_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  stringstream ss;
  stringstream asStack_198 [392];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::ostream::_M_insert<double>((double)(long)this / 1000.0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatTimeInMillisAsSeconds(TimeInMillis ms) {
  ::std::stringstream ss;
  ss << ms/1000.0;
  return ss.str();
}